

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.h
# Opt level: O0

uint crnlib::math::bitmask_size(uint mask)

{
  undefined4 local_10;
  undefined4 local_c;
  uint size;
  uint mask_local;
  
  local_10 = 0;
  for (local_c = mask; local_c != 0; local_c = local_c - 1 & local_c) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

inline uint bitmask_size(uint mask)
        {
            uint size = 0;
            while (mask)
            {
                mask &= (mask - 1U);
                size++;
            }
            return size;
        }